

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TranslateEH.cpp
# Opt level: O2

optional<unsigned_int> __thiscall
wasm::anon_unknown_157::TranslateToExnref::ExnrefLocalAssigner::getExnrefLocal
          (ExnrefLocalAssigner *this,Name rethrowTarget)

{
  const_iterator cVar1;
  ulong uVar2;
  ulong uVar3;
  undefined1 local_18 [8];
  Name rethrowTarget_local;
  
  rethrowTarget_local.super_IString.str._M_len = rethrowTarget.super_IString.str._M_str;
  local_18 = rethrowTarget.super_IString.str._M_len;
  cVar1 = std::
          _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->rethrowTargetToExnrefLocal)._M_h,(key_type *)local_18);
  if (cVar1.super__Node_iterator_base<std::pair<const_wasm::Name,_unsigned_int>,_true>._M_cur ==
      (__node_type *)0x0) {
    uVar2 = 0;
    uVar3 = 0;
  }
  else {
    uVar2 = (ulong)*(uint *)((long)cVar1.
                                   super__Node_iterator_base<std::pair<const_wasm::Name,_unsigned_int>,_true>
                                   ._M_cur + 0x18);
    uVar3 = 0x100000000;
  }
  return (optional<unsigned_int>)(uVar2 | uVar3);
}

Assistant:

std::optional<Index> getExnrefLocal(Name rethrowTarget) const {
      auto it = rethrowTargetToExnrefLocal.find(rethrowTarget);
      if (it == rethrowTargetToExnrefLocal.end()) {
        return {};
      } else {
        return it->second;
      }
    }